

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execNEST.cpp
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* GetBand(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *__return_storage_ptr__,vector<double,_std::allocator<double>_> *S1s,
         vector<double,_std::allocator<double>_> *S2s,bool resol,int nFold)

{
  pointer *ppdVar1;
  double dVar2;
  double dVar3;
  void *__dest;
  pointer pdVar4;
  bool bVar5;
  bool bVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  pointer pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  iterator iVar16;
  vector<double,std::allocator<double>> *this;
  long lVar17;
  size_type __new_size;
  ulong uVar18;
  double (*padVar19) [7];
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  pointer pvVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint64_t reject [1000];
  double local_1fd8;
  vector<double,_std::allocator<double>_> *local_1fd0;
  double local_1fc8;
  double local_1fc0;
  pointer local_1fb8;
  double dStack_1fb0;
  double local_1fa8;
  double dStack_1fa0;
  double local_1f90;
  double local_1f88;
  vector<double,_std::allocator<double>_> *local_1f80;
  value_type local_1f78 [333];
  
  __new_size = (size_type)numBins;
  local_1fd0 = S1s;
  local_1f80 = S2s;
  if (1000 < (long)__new_size) {
    if (0 < verbosity) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "ERROR: Too many bins. Decrease numBins (analysis.hh) or increase NUMBINS_MAX (TestSpectra.hh)"
                 ,0x5d);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    }
    exit(1);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(8);
  local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
  *local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
   ._M_start = -999.0;
  local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(__return_storage_ptr__,__new_size,local_1f78);
  pvVar7 = local_1f80;
  if (local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1fa8 = (double)numBins;
  pdVar9 = &maxS1;
  if (useS2 == 2) {
    pdVar9 = &maxS2;
  }
  local_1fc8 = *pdVar9;
  pdVar9 = &minS1;
  if (useS2 == 2) {
    pdVar9 = &minS2;
  }
  local_1fc0 = *pdVar9;
  memset(local_1f78,0,8000);
  if (resol) {
    numBins = 1;
    dVar3 = 1.79769313486232e+308;
  }
  else {
    dVar3 = (local_1fc8 - local_1fc0) / local_1fa8;
  }
  if (nFold == 0) {
    local_1f88 = -1.79769313486232e+308;
  }
  else {
    local_1f88 = 0.0;
  }
  pdVar8 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1fc8 = dVar3;
  if ((local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar8) {
    local_1fa8 = dVar3 * 0.5;
    local_1f90 = local_1fc0 + local_1fa8;
    uVar18 = 0;
    do {
      lVar10 = (long)numBins;
      if (0 < lVar10) {
        lVar14 = 0;
        padVar19 = band;
        lVar13 = 0;
        do {
          dVar22 = (double)(int)lVar13 * dVar3 + local_1f90;
          if (uVar18 == 0 && !resol) {
            (*padVar19)[0] = dVar22;
          }
          dVar2 = pdVar8[uVar18];
          dVar3 = local_1fc8;
          if (dVar22 - local_1fa8 < ABS(dVar2)) {
            if ((nFold == 0) || (ABS(dVar2) <= dVar22 + local_1fa8)) goto LAB_0010ca3f;
          }
          else if (nFold == 0) {
LAB_0010ca3f:
            if (local_1f88 <= dVar2) {
              pdVar8 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              dVar22 = pdVar8[uVar18];
              if (0.0 <= dVar22) {
                if (resol) {
                  pvVar23 = (__return_storage_ptr__->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  this = (vector<double,std::allocator<double>> *)
                         ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar14);
                  iVar16._M_current =
                       *(double **)
                        ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data + lVar14 + 8);
                  if (iVar16._M_current ==
                      *(double **)
                       ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data + lVar14 + 0x10)) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              (this,iVar16,pdVar8 + uVar18);
                  }
                  else {
                    *iVar16._M_current = dVar22;
LAB_0010cd4c:
                    *(double **)(this + 8) = iVar16._M_current + 1;
                  }
                }
                else {
                  bVar5 = dVar22 == 0.0;
                  bVar6 = dVar2 == 0.0;
                  if (useS2 == 1) {
                    if (((bVar6 || bVar5) || (dVar3 = log10(dVar22), dVar3 <= logMin)) ||
                       (dVar3 = log10((pvVar7->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data._M_start[uVar18]),
                       logMax <= dVar3)) {
                      pvVar23 = (__return_storage_ptr__->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      this = (vector<double,std::allocator<double>> *)
                             ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data + lVar14);
                      local_1fd8 = 0.0;
                      iVar16._M_current =
                           *(double **)
                            ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + lVar14 + 8);
                      if (iVar16._M_current !=
                          *(double **)
                           ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + lVar14 + 0x10))
                      goto LAB_0010cd45;
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                ((vector<double,_std::allocator<double>_> *)this,iVar16,&local_1fd8)
                      ;
                    }
                    else {
                      local_1fb8 = (__return_storage_ptr__->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                      local_1fd8 = log10((pvVar7->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start[uVar18]);
                      uVar20 = SUB84(local_1fd8,0);
                      uVar21 = (undefined4)((ulong)local_1fd8 >> 0x20);
                      iVar16._M_current =
                           *(double **)
                            ((long)&(local_1fb8->super__Vector_base<double,_std::allocator<double>_>
                                    )._M_impl.super__Vector_impl_data + lVar14 + 8);
                      if (iVar16._M_current !=
                          *(double **)
                           ((long)&(local_1fb8->super__Vector_base<double,_std::allocator<double>_>)
                                   ._M_impl.super__Vector_impl_data + lVar14 + 0x10))
                      goto LAB_0010ccb8;
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                ((vector<double,_std::allocator<double>_> *)
                                 ((long)&(local_1fb8->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar14),iVar16,
                                 &local_1fd8);
                    }
                  }
                  else if (useS2 == 0) {
                    if (((bVar6 || bVar5) || (dVar3 = log10(dVar22 / dVar2), dVar3 <= logMin)) ||
                       (dVar3 = log10((pvVar7->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data._M_start[uVar18] /
                                      (local_1fd0->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data._M_start[uVar18]), logMax <= dVar3)) {
                      pvVar23 = (__return_storage_ptr__->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      this = (vector<double,std::allocator<double>> *)
                             ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data + lVar14);
                      local_1fd8 = 0.0;
                      iVar16._M_current =
                           *(double **)
                            ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + lVar14 + 8);
                      if (iVar16._M_current !=
                          *(double **)
                           ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + lVar14 + 0x10)) {
LAB_0010cd45:
                        local_1fd8 = 0.0;
                        *iVar16._M_current = 0.0;
                        goto LAB_0010cd4c;
                      }
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                ((vector<double,_std::allocator<double>_> *)this,iVar16,&local_1fd8)
                      ;
                    }
                    else {
                      local_1fb8 = (__return_storage_ptr__->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                      local_1fd8 = log10((pvVar7->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start[uVar18] /
                                         (local_1fd0->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start[uVar18]);
                      uVar20 = SUB84(local_1fd8,0);
                      uVar21 = (undefined4)((ulong)local_1fd8 >> 0x20);
                      iVar16._M_current =
                           *(double **)
                            ((long)&(local_1fb8->super__Vector_base<double,_std::allocator<double>_>
                                    )._M_impl.super__Vector_impl_data + lVar14 + 8);
                      if (iVar16._M_current ==
                          *(double **)
                           ((long)&(local_1fb8->super__Vector_base<double,_std::allocator<double>_>)
                                   ._M_impl.super__Vector_impl_data + lVar14 + 0x10)) {
                        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                  ((vector<double,_std::allocator<double>_> *)
                                   ((long)&(local_1fb8->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data + lVar14),iVar16,
                                   &local_1fd8);
                      }
                      else {
LAB_0010ccb8:
                        *iVar16._M_current = (double)CONCAT44(uVar21,uVar20);
                        *(double **)
                         ((long)&(local_1fb8->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar14 + 8) =
                             iVar16._M_current + 1;
                      }
                    }
                  }
                  else if (((bVar6 || bVar5) || (dVar3 = log10(dVar2 / dVar22), dVar3 <= logMin)) ||
                          (dVar3 = log10((local_1fd0->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start[uVar18] /
                                         (pvVar7->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start[uVar18]),
                          logMax <= dVar3)) {
                    pvVar23 = (__return_storage_ptr__->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    this = (vector<double,std::allocator<double>> *)
                           ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + lVar14);
                    local_1fd8 = 0.0;
                    iVar16._M_current =
                         *(double **)
                          ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data + lVar14 + 8);
                    if (iVar16._M_current !=
                        *(double **)
                         ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar14 + 0x10))
                    goto LAB_0010cd45;
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              ((vector<double,_std::allocator<double>_> *)this,iVar16,&local_1fd8);
                  }
                  else {
                    local_1fb8 = (__return_storage_ptr__->
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                    local_1fd8 = log10((local_1fd0->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start[uVar18] /
                                       (pvVar7->super__Vector_base<double,_std::allocator<double>_>)
                                       ._M_impl.super__Vector_impl_data._M_start[uVar18]);
                    uVar20 = SUB84(local_1fd8,0);
                    uVar21 = (undefined4)((ulong)local_1fd8 >> 0x20);
                    iVar16._M_current =
                         *(double **)
                          ((long)&(local_1fb8->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data + lVar14 + 8);
                    if (iVar16._M_current !=
                        *(double **)
                         ((long)&(local_1fb8->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar14 + 0x10))
                    goto LAB_0010ccb8;
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              ((vector<double,_std::allocator<double>_> *)
                               ((long)&(local_1fb8->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar14),iVar16,&local_1fd8);
                  }
                }
                (*padVar19)[2] =
                     *(double *)
                      (*(long *)((long)&(((__return_storage_ptr__->
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar14 + 8) + -8) +
                     (*padVar19)[2];
                dVar22 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar18];
                dVar3 = local_1fc8;
                if (resol) {
                  (*padVar19)[0] = dVar22 + (*padVar19)[0];
                }
                else {
                  (*padVar19)[1] = dVar22 + (*padVar19)[1];
                }
                break;
              }
            }
            ppdVar1 = &local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar13;
            *ppdVar1 = (pointer)((long)*ppdVar1 + 1);
            break;
          }
          lVar13 = lVar13 + 1;
          padVar19 = padVar19 + 1;
          lVar14 = lVar14 + 0x18;
        } while (lVar10 * 0x18 != lVar14);
      }
      uVar18 = uVar18 + 1;
      pdVar8 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(local_1fd0->super__Vector_base<double,_std::allocator<double>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3)
            );
  }
  if (0 < numBins) {
    local_1fc0 = local_1fc0 + local_1fc8 * 0.5;
    lVar10 = 0;
    local_1f90 = (double)CONCAT71(local_1f90._1_7_,!resol);
    do {
      padVar19 = band + lVar10;
      if (band[lVar10][0] <= 0.0 && !resol) {
        (*padVar19)[0] = (double)(int)lVar10 * local_1fc8 + local_1fc0;
      }
      pvVar23 = (__return_storage_ptr__->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      __dest = pvVar23[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = *(pointer *)
                ((long)&pvVar23[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + 8);
      pdVar8 = (pointer)((long)__dest + 8);
      if (pdVar8 != pdVar4) {
        memmove(__dest,pdVar8,(long)pdVar4 - (long)pdVar8);
      }
      ppdVar1 = (pointer *)
                ((long)&pvVar23[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + 8);
      *ppdVar1 = *ppdVar1 + -1;
      pvVar23 = (__return_storage_ptr__->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = *(long *)&pvVar23[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data;
      lVar11 = (long)*(pointer *)
                      ((long)&pvVar23[lVar10].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data + 8) - lVar13;
      lVar12 = lVar11 >> 3;
      lVar14 = lVar12;
      if (lVar11 == 0 && local_1f90._0_1_ == '\0') {
        pdVar8 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar14 = (long)pdVar4 - (long)pdVar8 >> 3;
        if (pdVar4 != pdVar8) {
          dVar3 = (*padVar19)[0];
          lVar17 = 0;
          do {
            dVar3 = dVar3 + ABS(pdVar8[lVar17]);
            (*padVar19)[0] = dVar3;
            lVar17 = lVar17 + 1;
          } while (lVar14 + (ulong)(lVar14 == 0) != lVar17);
        }
      }
      auVar24._8_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar24._0_8_ = lVar14;
      auVar24._12_4_ = 0x45300000;
      dVar3 = (auVar24._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
      if (resol) {
        (*padVar19)[0] = (*padVar19)[0] / dVar3;
      }
      dVar22 = band[lVar10][2];
      band[lVar10][1] = band[lVar10][1] / dVar3;
      band[lVar10][2] = dVar22 / dVar3;
      auVar25._8_4_ = (int)(lVar11 >> 0x23);
      auVar25._0_8_ = lVar12;
      auVar25._12_4_ = 0x45300000;
      dStack_1fa0 = auVar25._8_8_ - 1.9342813113834067e+25;
      local_1fa8 = dStack_1fa0 + ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
      if (dVar3 <= local_1fa8) {
        local_1fa8 = dVar3;
      }
      uVar15 = (uint)local_1fa8;
      if (0 < (int)uVar15) {
        uVar18 = 0;
        do {
          dVar3 = *(double *)(lVar13 + uVar18 * 8);
          if ((dVar3 != -999.0) || (NAN(dVar3))) {
            dVar3 = dVar3 - band[lVar10][2];
            band[lVar10][3] = dVar3 * dVar3 + band[lVar10][3];
          }
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
      }
      pdVar8 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = (long)(local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar8;
      if (lVar13 != 0) {
        lVar13 = lVar13 >> 3;
        lVar14 = 0;
        do {
          if (((resol) && (dVar3 = pdVar8[lVar14], local_1f88 < dVar3)) &&
             (0.0 < (local_1f80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar14])) {
            dVar3 = dVar3 - (*padVar19)[0];
            band[lVar10][1] = dVar3 * dVar3 + band[lVar10][1];
          }
          lVar14 = lVar14 + 1;
        } while (lVar13 + (ulong)(lVar13 == 0) != lVar14);
      }
      pvVar23 = (pointer)(local_1fa8 + -1.0);
      dVar3 = band[lVar10][3] / (double)pvVar23;
      if (dVar3 < 0.0) {
        local_1fb8 = pvVar23;
        dStack_1fb0 = dStack_1fa0;
        dVar3 = sqrt(dVar3);
        pvVar23 = local_1fb8;
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      band[lVar10][3] = dVar3;
      if (resol) {
        dVar3 = band[lVar10][1] / (double)pvVar23;
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        band[lVar10][1] = dVar3;
      }
      if (local_1fa8 < 0.0) {
        local_1fb8 = (pointer)band[lVar10][3];
        dVar3 = sqrt(local_1fa8);
        pvVar23 = local_1fb8;
      }
      else {
        dVar3 = SQRT(local_1fa8);
        pvVar23 = (pointer)band[lVar10][3];
      }
      band[lVar10][4] = (double)pvVar23 / dVar3;
      pdVar8 = (&local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start)[lVar10];
      band[lVar10][5] =
           local_1fa8 /
           (((double)CONCAT44(0x45300000,(int)((ulong)pdVar8 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)pdVar8) - 4503599627370496.0) + local_1fa8);
      if (0 < (int)uVar15) {
        uVar18 = 0;
        do {
          dVar3 = *(double *)
                   (*(long *)&(__return_storage_ptr__->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar10].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + uVar18 * 8);
          if ((dVar3 != -999.0) || (NAN(dVar3))) {
            dVar3 = pow((dVar3 - band[lVar10][2]) / band[lVar10][3],3.0);
            band[lVar10][6] = dVar3 + band[lVar10][6];
          }
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
      }
      band[lVar10][6] = band[lVar10][6] / (local_1fa8 + -2.0);
      lVar10 = lVar10 + 1;
    } while (lVar10 < numBins);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double>> GetBand(vector<double> S1s, vector<double> S2s,
                               bool resol, int nFold) {
  if (numBins > NUMBINS_MAX) {
    if (verbosity > 0)
      cerr << "ERROR: Too many bins. Decrease numBins (analysis.hh) or "
              "increase NUMBINS_MAX (TestSpectra.hh)"
           << endl;
    exit(EXIT_FAILURE);
  }

  vector<vector<double>> signals;
  signals.resize(numBins, vector<double>(1, -999.));
  double binWidth, border;
  if (useS2 == 2) {
    binWidth = (maxS2 - minS2) / double(numBins);
    border = minS2;
  } else {
    binWidth = (maxS1 - minS1) / double(numBins);
    border = minS1;
  }
  int i = 0, j = 0;
  double s1c, numPts;
  uint64_t reject[NUMBINS_MAX] = {0};

  if (resol) {
    numBins = 1;
    binWidth = DBL_MAX;
  }

  double ReqS1 = 0.;
  if (nFold == 0) ReqS1 = -DBL_MAX;
  for (i = 0; i < S1s.size(); ++i) {
    for (j = 0; j < numBins; ++j) {
      s1c = border + binWidth / 2. + double(j) * binWidth;
      if (i == 0 && !resol) band[j][0] = s1c;
      if ((std::abs(S1s[i]) > (s1c - binWidth / 2.) &&
           std::abs(S1s[i]) <= (s1c + binWidth / 2.)) ||
          !nFold) {
        if (S1s[i] >= ReqS1 && S2s[i] >= 0.) {
          if (resol) {
            signals[j].push_back(S2s[i]);
          } else {
            if (useS2 == 0) {
              if (S1s[i] && S2s[i] && log10(S2s[i] / S1s[i]) > logMin &&
                  log10(S2s[i] / S1s[i]) < logMax)
                signals[j].push_back(log10(S2s[i] / S1s[i]));
              else
                signals[j].push_back(0.);
            } else if (useS2 == 1) {
              if (S1s[i] && S2s[i] && log10(S2s[i]) > logMin &&
                  log10(S2s[i]) < logMax)
                signals[j].push_back(log10(S2s[i]));
              else
                signals[j].push_back(0.);
            } else {
              if (S1s[i] && S2s[i] && log10(S1s[i] / S2s[i]) > logMin &&
                  log10(S1s[i] / S2s[i]) < logMax)
                signals[j].push_back(log10(S1s[i] / S2s[i]));
              else
                signals[j].push_back(0.);
            }
          }
          band[j][2] += signals[j].back();
          if (resol)
            band[j][0] += S1s[i];
          else
            band[j][1] += S1s[i];
        } else
          ++reject[j];
        break;
      }
    }
  }

  for (j = 0; j < numBins; ++j) {
    if (band[j][0] <= 0. && !resol)
      band[j][0] = border + binWidth / 2. + double(j) * binWidth;
    signals[j].erase(signals[j].begin());
    numPts = (double)signals[j].size();
    if (numPts <= 0 && resol) {
      for (i = 0; i < S1s.size(); ++i) band[j][0] += std::abs(S1s[i]);
      numPts = S1s.size();
    }
    if (resol) band[j][0] /= numPts;
    band[j][1] /= numPts;
    band[j][2] /= numPts;
    if (numPts > signals[j].size())
      numPts = signals[j].size();  // seg fault prevention line
    for (i = 0; i < (int)numPts; ++i) {
      if (signals[j][i] != -999.)
        band[j][3] += pow(signals[j][i] - band[j][2], 2.);  // std dev calc
    }
    for (i = 0; i < S1s.size(); ++i) {
      if (resol && S1s[i] > ReqS1 && S2s[i] > 0.0)
        band[j][1] += pow(S1s[i] - band[j][0], 2.);  // std dev calc
    }
    band[j][3] /= numPts - 1.;
    band[j][3] = sqrt(band[j][3]);
    if (resol) {
      band[j][1] /= numPts - 1.;
      band[j][1] = sqrt(band[j][1]);
    }
    band[j][4] = band[j][3] / sqrt(numPts);
    band[j][5] = numPts / (numPts + double(reject[j]));
    for (i = 0; i < (int)numPts; ++i) {
      if (signals[j][i] != -999.)
        band[j][6] +=
            pow((signals[j][i] - band[j][2]) / band[j][3], 3.);  // skew calc
    }
    band[j][6] /= (numPts - 2.);
  }

  return signals;
}